

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg.c
# Opt level: O0

double ogg_stream_get_length(ALLEGRO_AUDIO_STREAM *stream)

{
  long in_RDI;
  double dVar1;
  double ret;
  AL_OV_DATA *extra;
  
  dVar1 = (*lib.ov_time_total)((OggVorbis_File *)**(undefined8 **)(in_RDI + 0x1a0),-1);
  return dVar1;
}

Assistant:

static double ogg_stream_get_length(ALLEGRO_AUDIO_STREAM *stream)
{
   AL_OV_DATA *extra = (AL_OV_DATA *) stream->extra;
#ifndef TREMOR
   double ret = lib.ov_time_total(extra->vf, -1);
#else
   double ret = lib.ov_time_total(extra->vf, -1)/1000.0;
#endif
   return ret;
}